

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSProperty * add_property(JSContext *ctx,JSObject *p,JSAtom prop,int prop_flags)

{
  JSShape **psh;
  JSRuntime *pJVar1;
  JSShape **ppJVar2;
  uint uVar3;
  int iVar4;
  JSProperty *pJVar5;
  JSShape *pJVar6;
  ulong uVar7;
  ulong uVar8;
  JSShape *pJVar9;
  
  psh = &p->shape;
  pJVar6 = p->shape;
  if (pJVar6->is_hashed != '\0') {
    uVar3 = ((pJVar6->hash + prop) * -0x61c8ffff + prop_flags) * -0x61c8ffff;
    for (pJVar9 = ctx->rt->shape_hash[uVar3 >> (-(char)ctx->rt->shape_hash_bits & 0x1fU)];
        pJVar9 != (JSShape *)0x0; pJVar9 = pJVar9->shape_hash_next) {
      if (((pJVar9->hash == uVar3) && (pJVar9->proto == pJVar6->proto)) &&
         (uVar7 = (ulong)(uint)pJVar6->prop_count, pJVar9->prop_count == pJVar6->prop_count + 1U)) {
        if (uVar7 != 0) {
          uVar8 = 0;
          do {
            if ((*(int *)(&pJVar9[1].header.field_0x4 + uVar8 * 8) !=
                 *(int *)(&pJVar6[1].header.field_0x4 + uVar8 * 8)) ||
               (0x3ffffff <
                (uint)((&pJVar6[1].header.ref_count)[uVar8 * 2] ^
                      (&pJVar9[1].header.ref_count)[uVar8 * 2]))) goto LAB_00120c19;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        if ((*(JSAtom *)(&pJVar9[1].header.field_0x4 + uVar7 * 8) == prop) &&
           ((uint)(&pJVar9[1].header.ref_count)[uVar7 * 2] >> 0x1a == prop_flags))
        goto LAB_00120c22;
      }
LAB_00120c19:
    }
    pJVar9 = (JSShape *)0x0;
LAB_00120c22:
    if (pJVar9 != (JSShape *)0x0) {
      if (pJVar9->prop_size != pJVar6->prop_size) {
        pJVar5 = (JSProperty *)js_realloc(ctx,p->prop,(long)pJVar9->prop_size << 4);
        if (pJVar5 == (JSProperty *)0x0) {
          return (JSProperty *)0x0;
        }
        p->prop = pJVar5;
      }
      (pJVar9->header).ref_count = (pJVar9->header).ref_count + 1;
      *psh = pJVar9;
      pJVar1 = ctx->rt;
      iVar4 = (pJVar6->header).ref_count;
      (pJVar6->header).ref_count = iVar4 + -1;
      if (iVar4 < 2) {
        js_free_shape0(pJVar1,pJVar6);
      }
      goto LAB_00120cff;
    }
    if ((pJVar6->header).ref_count != 1) {
      pJVar6 = js_clone_shape(ctx,pJVar6);
      if (pJVar6 == (JSShape *)0x0) {
        return (JSProperty *)0x0;
      }
      pJVar6->is_hashed = '\x01';
      pJVar1 = ctx->rt;
      uVar3 = pJVar6->hash >> (-(char)pJVar1->shape_hash_bits & 0x1fU);
      ppJVar2 = pJVar1->shape_hash;
      pJVar6->shape_hash_next = ppJVar2[uVar3];
      ppJVar2[uVar3] = pJVar6;
      pJVar1->shape_hash_count = pJVar1->shape_hash_count + 1;
      pJVar1 = ctx->rt;
      pJVar9 = *psh;
      iVar4 = (pJVar9->header).ref_count;
      (pJVar9->header).ref_count = iVar4 + -1;
      if (iVar4 < 2) {
        js_free_shape0(pJVar1,pJVar9);
      }
      *psh = pJVar6;
    }
  }
  iVar4 = add_shape_property(ctx,psh,p,prop,prop_flags);
  if (iVar4 != 0) {
    return (JSProperty *)0x0;
  }
  pJVar9 = *psh;
LAB_00120cff:
  return p->prop + (long)pJVar9->prop_count + -1;
}

Assistant:

static JSProperty *add_property(JSContext *ctx,
                                JSObject *p, JSAtom prop, int prop_flags)
{
    JSShape *sh, *new_sh;

    sh = p->shape;
    if (sh->is_hashed) {
        /* try to find an existing shape */
        new_sh = find_hashed_shape_prop(ctx->rt, sh, prop, prop_flags);
        if (new_sh) {
            /* matching shape found: use it */
            /*  the property array may need to be resized */
            if (new_sh->prop_size != sh->prop_size) {
                JSProperty *new_prop;
                new_prop = js_realloc(ctx, p->prop, sizeof(p->prop[0]) *
                                      new_sh->prop_size);
                if (!new_prop)
                    return NULL;
                p->prop = new_prop;
            }
            p->shape = js_dup_shape(new_sh);
            js_free_shape(ctx->rt, sh);
            return &p->prop[new_sh->prop_count - 1];
        } else if (sh->header.ref_count != 1) {
            /* if the shape is shared, clone it */
            new_sh = js_clone_shape(ctx, sh);
            if (!new_sh)
                return NULL;
            /* hash the cloned shape */
            new_sh->is_hashed = TRUE;
            js_shape_hash_link(ctx->rt, new_sh);
            js_free_shape(ctx->rt, p->shape);
            p->shape = new_sh;
        }
    }
    assert(p->shape->header.ref_count == 1);
    if (add_shape_property(ctx, &p->shape, p, prop, prop_flags))
        return NULL;
    return &p->prop[p->shape->prop_count - 1];
}